

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O0

int SUNLinSol_SPFGMRSetPrecType(SUNLinearSolver S,int pretype)

{
  undefined4 uVar1;
  bool bVar2;
  int pretype_local;
  SUNLinearSolver S_local;
  
  bVar2 = true;
  if ((pretype != 1) && (bVar2 = true, pretype != 2)) {
    bVar2 = pretype == 3;
  }
  uVar1 = 0;
  if (bVar2) {
    uVar1 = 2;
  }
  if (S == (SUNLinearSolver)0x0) {
    S_local._4_4_ = -1;
  }
  else {
    *(undefined4 *)((long)S->content + 4) = uVar1;
    S_local._4_4_ = 0;
  }
  return S_local._4_4_;
}

Assistant:

SUNDIALS_EXPORT int SUNLinSol_SPFGMRSetPrecType(SUNLinearSolver S, int pretype) 
{
  /* Check for legal pretype */ 
  pretype = ( (pretype == PREC_LEFT)  ||
              (pretype == PREC_RIGHT) ||
              (pretype == PREC_BOTH) ) ? PREC_RIGHT : PREC_NONE;

  /* Check for non-NULL SUNLinearSolver */
  if (S == NULL) return(SUNLS_MEM_NULL);

  /* Set pretype */
  SPFGMR_CONTENT(S)->pretype = pretype;
  return(SUNLS_SUCCESS);
}